

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O2

char * stumpless_get_target_name(stumpless_target *target)

{
  char *__dest;
  
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
    __dest = (char *)0x0;
  }
  else {
    lock_target(target);
    __dest = (char *)alloc_mem(target->name_length + 1);
    if (__dest != (char *)0x0) {
      memcpy(__dest,target->name,target->name_length + 1);
      clear_error();
    }
    unlock_target(target);
  }
  return __dest;
}

Assistant:

const char *
stumpless_get_target_name( const struct stumpless_target *target ) {
  char *name_copy;

  VALIDATE_ARG_NOT_NULL( target );

  lock_target( target );
  name_copy = alloc_mem( target->name_length + 1 );
  if( !name_copy ) {
    goto cleanup_and_return;
  }
  memcpy( name_copy, target->name, target->name_length + 1 );
  clear_error(  );

cleanup_and_return:
  unlock_target( target );
  return name_copy;
}